

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O0

void __thiscall
supermap::SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>::append
          (SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void> *this,
          unique_ptr<supermap::KeyValue<char,_char>,_std::default_delete<supermap::KeyValue<char,_char>_>_>
          *item)

{
  type pKVar1;
  CountingStorageItemRegister<supermap::KeyValue<char,_char>,_char,_void> *pCVar2;
  size_t __n;
  void *__buf;
  SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void> *in_RDI;
  OutputIterator<supermap::KeyValue<char,_char>,_void> writer;
  path *this_00;
  format in_stack_ffffffffffffff87;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  path *in_stack_ffffffffffffff90;
  FileManager *in_stack_ffffffffffffff98;
  undefined1 local_28 [40];
  
  this_00 = (path *)local_28;
  getFileManager(in_RDI);
  std::__shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x18f340);
  SingleFileIndexedStorage<supermap::KeyValue<char,char>,char,void>::getStorageFilePath_abi_cxx11_
            (in_RDI);
  std::filesystem::__cxx11::path::path
            (in_stack_ffffffffffffff90,
             (string_type *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
             in_stack_ffffffffffffff87);
  __n = 1;
  io::FileManager::getOutputIterator<supermap::KeyValue<char,char>>
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff8f);
  std::filesystem::__cxx11::path::~path(this_00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x18f3ae);
  pKVar1 = std::
           unique_ptr<supermap::KeyValue<char,_char>,_std::default_delete<supermap::KeyValue<char,_char>_>_>
           ::operator*((unique_ptr<supermap::KeyValue<char,_char>,_std::default_delete<supermap::KeyValue<char,_char>_>_>
                        *)this_00);
  io::OutputIterator<supermap::KeyValue<char,_char>,_void>::write
            ((OutputIterator<supermap::KeyValue<char,_char>,_void> *)(local_28 + 0x10),(int)pKVar1,
             __buf,__n);
  io::OutputIterator<supermap::KeyValue<char,_char>,_void>::flush
            ((OutputIterator<supermap::KeyValue<char,_char>,_void> *)0x18f3da);
  pCVar2 = OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>::getRegister
                     ((OrderedStorage<supermap::KeyValue<char,_char>,_char,_void> *)in_RDI);
  pKVar1 = std::
           unique_ptr<supermap::KeyValue<char,_char>,_std::default_delete<supermap::KeyValue<char,_char>_>_>
           ::operator*((unique_ptr<supermap::KeyValue<char,_char>,_std::default_delete<supermap::KeyValue<char,_char>_>_>
                        *)this_00);
  (*(pCVar2->
    super_StorageItemRegister<supermap::KeyValue<char,_char>,_supermap::CountingStorageInfo<char,_void>_>
    ).
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_supermap::CountingStorageInfo<char,_void>_>_>
    ._vptr_Cloneable[3])(pCVar2,pKVar1);
  io::OutputIterator<supermap::KeyValue<char,_char>,_void>::~OutputIterator
            ((OutputIterator<supermap::KeyValue<char,_char>,_void> *)0x18f416);
  return;
}

Assistant:

void append(std::unique_ptr<T> &&item) override {
        io::OutputIterator<T> writer = getFileManager()->template getOutputIterator<T>(getStorageFilePath(), true);
        writer.write(*item);
        writer.flush();
        getRegister().registerItem(*item);
    }